

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blockchain.cpp
# Opt level: O2

void __thiscall Blockchain::Blockchain(Blockchain *this)

{
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  string local_c8;
  Block local_a8;
  
  this->_bIndex = 1;
  (this->_bChain).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_bChain).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_bChain).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_c8,"Genesis Block",&local_e9);
  std::__cxx11::string::string((string *)&local_e8,anon_var_dwarf_2e23b + 0xc,&local_ea);
  Block::Block(&local_a8,1,&local_c8,&local_e8);
  std::vector<Block,_std::allocator<Block>_>::emplace_back<Block>(&this->_bChain,&local_a8);
  Block::~Block(&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

Blockchain::Blockchain()
{
	_bChain.emplace_back(Block(_bIndex,"Genesis Block", ""));
}